

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::JSONParser::ParseLaneConstValue
          (JSONParser *this,Type lane_type,int lane,ExpectedValue *out_value,string_view value_str,
          AllowExpected allow_expected)

{
  Type TVar1;
  Type TVar2;
  Result RVar3;
  char *__function;
  uint32_t value;
  ExpectedNan nan;
  v128 v;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined2 uStack_36;
  Index IStack_34;
  undefined4 local_2c;
  Type local_28 [3];
  
  local_28[0] = (Type)(out_value->value).value.field_0.i64_;
  local_28[1] = *(Type *)((long)&(out_value->value).value.field_0 + 8);
  local_28[2] = lane_type;
  switch(lane_type.enum_) {
  case I16:
    RVar3 = ParseI32Value(this,(uint32_t *)&local_38,value_str);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    if (0x10 < (long)lane * 2 + 2U) {
      __function = "void v128::From(int, T) [T = unsigned short]";
      goto LAB_001242bf;
    }
    *(ushort *)((long)&local_28[0].enum_ + (long)lane * 2) = CONCAT11(uStack_37,local_38);
    goto LAB_00124239;
  case I8:
    RVar3 = ParseI32Value(this,(uint32_t *)&local_38,value_str);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    if (lane + 1U < 0x11) {
      *(undefined1 *)((long)&local_28[0].enum_ + (long)lane) = local_38;
      goto LAB_00124239;
    }
    __function = "void v128::From(int, T) [T = unsigned char]";
    goto LAB_001242bf;
  default:
    ParseLaneConstValue();
    return (Result)Error;
  case F64:
    RVar3 = ParseF64Value(this,(uint64_t *)&local_38,&local_2c,value_str,allow_expected);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    if ((long)lane * 8 + 8U < 0x11) {
      TVar1.enum_._1_1_ = uStack_37;
      TVar1.enum_._0_1_ = local_38;
      TVar1.enum_._2_2_ = uStack_36;
      TVar1.type_index_ = IStack_34;
      local_28[lane] = TVar1;
      if (1 < lane) {
        __assert_fail("lane < 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                      ,0x2f1,
                      "wabt::Result spectest::JSONParser::ParseLaneConstValue(Type, int, ExpectedValue *, std::string_view, AllowExpected)"
                     );
      }
LAB_001241fc:
      out_value->nan[lane] = local_2c;
LAB_00124239:
      if (RVar3.enum_ != Error) {
        (out_value->value).value.field_0.i64_ = (u64)local_28[0];
        *(Type *)((long)&(out_value->value).value.field_0 + 8) = local_28[1];
        return (Result)Ok;
      }
      return (Result)Error;
    }
    break;
  case F32:
    RVar3 = ParseF32Value(this,&local_2c,(ExpectedNan *)&local_38,value_str,allow_expected);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    if ((long)lane * 4 + 4U < 0x11) {
      (&local_28[0].enum_)[lane] = local_2c;
      if (3 < lane) {
        __assert_fail("lane < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                      ,0x2e7,
                      "wabt::Result spectest::JSONParser::ParseLaneConstValue(Type, int, ExpectedValue *, std::string_view, AllowExpected)"
                     );
      }
      local_2c = CONCAT22(uStack_36,CONCAT11(uStack_37,local_38));
      goto LAB_001241fc;
    }
    goto LAB_0012427c;
  case I64:
    RVar3 = ParseI64Value(this,(uint64_t *)&local_38,value_str);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    if ((long)lane * 8 + 8U < 0x11) {
      TVar2.enum_._1_1_ = uStack_37;
      TVar2.enum_._0_1_ = local_38;
      TVar2.enum_._2_2_ = uStack_36;
      TVar2.type_index_ = IStack_34;
      local_28[lane] = TVar2;
      goto LAB_00124239;
    }
    break;
  case I32:
    RVar3 = ParseI32Value(this,(uint32_t *)&local_38,value_str);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    if ((long)lane * 4 + 4U < 0x11) {
      (&local_28[0].enum_)[lane] = CONCAT22(uStack_36,CONCAT11(uStack_37,local_38));
      goto LAB_00124239;
    }
LAB_0012427c:
    __function = "void v128::From(int, T) [T = unsigned int]";
    goto LAB_001242bf;
  }
  __function = "void v128::From(int, T) [T = unsigned long]";
LAB_001242bf:
  __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/common.h"
                ,0x95,__function);
}

Assistant:

wabt::Result JSONParser::ParseLaneConstValue(Type lane_type,
                                             int lane,
                                             ExpectedValue* out_value,
                                             std::string_view value_str,
                                             AllowExpected allow_expected) {
  v128 v = out_value->value.value.Get<v128>();

  switch (lane_type) {
    case Type::I8: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u8(lane, value);
      break;
    }

    case Type::I16: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u16(lane, value);
      break;
    }

    case Type::I32: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u32(lane, value);
      break;
    }

    case Type::I64: {
      uint64_t value;
      CHECK_RESULT(ParseI64Value(&value, value_str));
      v.set_u64(lane, value);
      break;
    }

    case Type::F32: {
      ExpectedNan nan;
      uint32_t value_bits;
      CHECK_RESULT(ParseF32Value(&value_bits, &nan, value_str, allow_expected));
      v.set_f32_bits(lane, value_bits);
      assert(lane < 4);
      out_value->nan[lane] = nan;
      break;
    }

    case Type::F64: {
      ExpectedNan nan;
      uint64_t value_bits;
      CHECK_RESULT(ParseF64Value(&value_bits, &nan, value_str, allow_expected));
      v.set_f64_bits(lane, value_bits);
      assert(lane < 2);
      out_value->nan[lane] = nan;
      break;
    }

    default:
      PrintError("unknown concrete type: \"%s\"", lane_type.GetName().c_str());
      return wabt::Result::Error;
  }

  out_value->value.value.Set<v128>(v);
  return wabt::Result::Ok;
}